

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderCmp(Fts3SegReader *pLhs,Fts3SegReader *pRhs)

{
  int iVar1;
  int iVar2;
  
  if (pLhs->aNode == (char *)0x0) {
    iVar1 = -(uint)(pRhs->aNode == (char *)0x0);
  }
  else {
    if (pRhs->aNode != (char *)0x0) {
      iVar2 = pLhs->nTerm - pRhs->nTerm;
      iVar1 = pRhs->nTerm;
      if (iVar2 < 0) {
        iVar1 = pLhs->nTerm;
      }
      iVar1 = memcmp(pLhs->zTerm,pRhs->zTerm,(long)iVar1);
      if (iVar1 != 0) {
        iVar2 = iVar1;
      }
      goto LAB_0019f454;
    }
    iVar1 = -1;
  }
  iVar2 = iVar1 + (uint)(pLhs->aNode == (char *)0x0);
LAB_0019f454:
  if (iVar2 == 0) {
    iVar2 = pRhs->iIdx - pLhs->iIdx;
  }
  return iVar2;
}

Assistant:

static int fts3SegReaderCmp(Fts3SegReader *pLhs, Fts3SegReader *pRhs){
  int rc;
  if( pLhs->aNode && pRhs->aNode ){
    int rc2 = pLhs->nTerm - pRhs->nTerm;
    if( rc2<0 ){
      rc = memcmp(pLhs->zTerm, pRhs->zTerm, pLhs->nTerm);
    }else{
      rc = memcmp(pLhs->zTerm, pRhs->zTerm, pRhs->nTerm);
    }
    if( rc==0 ){
      rc = rc2;
    }
  }else{
    rc = (pLhs->aNode==0) - (pRhs->aNode==0);
  }
  if( rc==0 ){
    rc = pRhs->iIdx - pLhs->iIdx;
  }
  assert( rc!=0 );
  return rc;
}